

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall
ACSStringPool::FindString(ACSStringPool *this,char *str,size_t len,uint h,uint bucketnum)

{
  uint uVar1;
  PoolEntry *pPVar2;
  char *__s1;
  int iVar3;
  PoolEntry *pPVar4;
  uint uVar5;
  
  if (this->PoolBuckets[bucketnum] != 0xffffffff) {
    pPVar2 = (this->Pool).Array;
    uVar5 = this->PoolBuckets[bucketnum];
    do {
      uVar1 = pPVar2[uVar5].Next;
      if (uVar1 == 0xfffffffe) {
        __assert_fail("entry->Next != FREE_ENTRY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                      ,0x28b,
                      "int ACSStringPool::FindString(const char *, size_t, unsigned int, unsigned int)"
                     );
      }
      pPVar4 = pPVar2 + uVar5;
      if (((pPVar4->Hash == h) && (__s1 = (pPVar4->Str).Chars, *(uint *)(__s1 + -0xc) == len)) &&
         (iVar3 = bcmp(__s1,str,len), iVar3 == 0)) {
        return uVar5;
      }
      uVar5 = uVar1;
    } while (uVar1 != 0xffffffff);
  }
  return -1;
}

Assistant:

int ACSStringPool::FindString(const char *str, size_t len, unsigned int h, unsigned int bucketnum)
{
	unsigned int i = PoolBuckets[bucketnum];
	while (i != NO_ENTRY)
	{
		PoolEntry *entry = &Pool[i];
		assert(entry->Next != FREE_ENTRY);
		if (entry->Hash == h && entry->Str.Len() == len &&
			memcmp(entry->Str.GetChars(), str, len) == 0)
		{
			return i;
		}
		i = entry->Next;
	}
	return -1;
}